

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_char,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f)

{
  uchar uVar1;
  uint uVar2;
  u8 i;
  long lVar3;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar4;
  SR result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> local_40;
  uchar local_30 [16];
  
  uVar2 = Pop<unsigned_int>(this);
  SVar4 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_30[0] = SVar4.v[0];
  local_30[1] = SVar4.v[1];
  local_30[2] = SVar4.v[2];
  local_30[3] = SVar4.v[3];
  local_30[4] = SVar4.v[4];
  local_30[5] = SVar4.v[5];
  local_30[6] = SVar4.v[6];
  local_30[7] = SVar4.v[7];
  local_30[8] = SVar4.v[8];
  local_30[9] = SVar4.v[9];
  local_30[10] = SVar4.v[10];
  local_30[0xb] = SVar4.v[0xb];
  local_30[0xc] = SVar4.v[0xc];
  local_30[0xd] = SVar4.v[0xd];
  local_30[0xe] = SVar4.v[0xe];
  local_30[0xf] = SVar4.v[0xf];
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    uVar1 = (*f)(local_30[lVar3],(uchar)uVar2);
    local_40.v[lVar3] = uVar1;
  }
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,local_40);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}